

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void WebPCopyPixels(WebPPicture *src,WebPPicture *dst)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint32_t *__src;
  int iVar4;
  uint32_t *__dest;
  
  __src = src->argb;
  iVar1 = src->argb_stride;
  __dest = dst->argb;
  iVar2 = dst->argb_stride;
  iVar3 = src->width;
  for (iVar4 = src->height; 0 < iVar4; iVar4 = iVar4 + -1) {
    memcpy(__dest,__src,(long)iVar3 << 2);
    __src = __src + iVar1;
    __dest = __dest + iVar2;
  }
  return;
}

Assistant:

void WebPCopyPixels(const WebPPicture* const src, WebPPicture* const dst) {
  assert(src != NULL && dst != NULL);
  assert(src->width == dst->width && src->height == dst->height);
  assert(src->use_argb && dst->use_argb);
  WebPCopyPlane((uint8_t*)src->argb, 4 * src->argb_stride, (uint8_t*)dst->argb,
                4 * dst->argb_stride, 4 * src->width, src->height);
}